

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

JsonArrayWriter * __thiscall Catch::JsonReporter::startArray(JsonReporter *this)

{
  reference pvVar1;
  JsonArrayWriter *in_RDI;
  JsonArrayWriter *this_00;
  JsonArrayWriter local_20;
  
  this_00 = (JsonArrayWriter *)&in_RDI[9].m_should_comma;
  std::
  stack<Catch::JsonArrayWriter,_std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>_>
  ::top((stack<Catch::JsonArrayWriter,_std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>_>
         *)0x1a3503);
  JsonArrayWriter::writeArray(&local_20);
  std::
  stack<Catch::JsonArrayWriter,_std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>_>
  ::emplace<Catch::JsonArrayWriter>
            ((stack<Catch::JsonArrayWriter,_std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>_>
              *)this_00,in_RDI);
  JsonArrayWriter::~JsonArrayWriter(this_00);
  std::
  stack<Catch::JsonReporter::Writer,_std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>_>
  ::emplace<Catch::JsonReporter::Writer>
            ((stack<Catch::JsonReporter::Writer,_std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>_>
              *)this_00,(Writer *)in_RDI);
  pvVar1 = std::
           stack<Catch::JsonArrayWriter,_std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>_>
           ::top((stack<Catch::JsonArrayWriter,_std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>_>
                  *)0x1a355d);
  return pvVar1;
}

Assistant:

JsonArrayWriter& JsonReporter::startArray() {
        m_arrayWriters.emplace( m_arrayWriters.top().writeArray() );
        m_writers.emplace( Writer::Array );
        return m_arrayWriters.top();
    }